

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

void __thiscall
FxMultiNameState::FxMultiNameState(FxMultiNameState *this,char *_statestring,FScriptPosition *pos)

{
  long lVar1;
  char *pcVar2;
  TArray<FName,_FName> *other;
  FString local_48;
  FName local_40;
  int local_3c;
  int scopeindex;
  FString statestring;
  FName scopename;
  FScriptPosition *pos_local;
  char *_statestring_local;
  FxMultiNameState *this_local;
  
  FxExpression::FxExpression(&this->super_FxExpression,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxMultiNameState_00b8a538;
  TArray<FName,_FName>::TArray(&this->names);
  FName::FName((FName *)&statestring);
  FString::FString((FString *)&stack0xffffffffffffffc8,_statestring);
  lVar1 = FString::IndexOf((FString *)&stack0xffffffffffffffc8,"::",0);
  local_3c = (int)lVar1;
  if (local_3c < 0) {
    FName::operator=((FName *)&statestring,(char *)0x0);
  }
  else {
    pcVar2 = FString::operator_cast_to_char_((FString *)&stack0xffffffffffffffc8);
    FName::FName(&local_40,pcVar2,(long)local_3c,false);
    FName::operator=((FName *)&statestring,&local_40);
    FString::Len((FString *)&stack0xffffffffffffffc8);
    FString::Right(&local_48,(size_t)&stack0xffffffffffffffc8);
    FString::operator=((FString *)&stack0xffffffffffffffc8,&local_48);
    FString::~FString(&local_48);
  }
  pcVar2 = FString::operator_cast_to_char_((FString *)&stack0xffffffffffffffc8);
  other = MakeStateNameList(pcVar2);
  TArray<FName,_FName>::operator=(&this->names,other);
  TArray<FName,_FName>::Insert(&this->names,0,(FName *)&statestring);
  this->scope = (PClassActor *)0x0;
  FString::~FString((FString *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

FxMultiNameState::FxMultiNameState(const char *_statestring, const FScriptPosition &pos)
	:FxExpression(pos)
{
	FName scopename;
	FString statestring = _statestring;
	int scopeindex = statestring.IndexOf("::");

	if (scopeindex >= 0)
	{
		scopename = FName(statestring, scopeindex, false);
		statestring = statestring.Right(statestring.Len() - scopeindex - 2);
	}
	else
	{
		scopename = NULL;
	}
	names = MakeStateNameList(statestring);
	names.Insert(0, scopename);
	scope = NULL;
}